

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# masked_sad_intrin_ssse3.c
# Opt level: O2

uint aom_highbd_masked_sad4xh_ssse3
               (uint8_t *src8,int src_stride,uint8_t *a8,int a_stride,uint8_t *b8,int b_stride,
               uint8_t *m_ptr,int m_stride,int height)

{
  undefined8 uVar1;
  undefined8 uVar2;
  ulong uVar3;
  undefined8 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined1 auVar7 [15];
  undefined1 auVar8 [15];
  undefined1 auVar9 [15];
  undefined1 auVar10 [15];
  undefined1 auVar11 [15];
  undefined1 auVar12 [15];
  undefined1 auVar13 [15];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  undefined1 auVar16 [15];
  unkuint9 Var17;
  undefined1 auVar18 [15];
  undefined1 auVar19 [15];
  ulong *puVar20;
  int iVar21;
  undefined8 *puVar22;
  undefined8 *puVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar30 [16];
  ushort uVar34;
  ulong uVar35;
  undefined1 uVar39;
  short sVar38;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar40 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  
  puVar22 = (undefined8 *)((long)src8 * 2);
  puVar20 = (ulong *)((long)a8 * 2);
  puVar23 = (undefined8 *)((long)b8 * 2);
  auVar24 = (undefined1  [16])0x0;
  for (iVar21 = 0; iVar21 < height; iVar21 = iVar21 + 2) {
    uVar1 = *(undefined8 *)((long)puVar22 + (long)src_stride * 2);
    uVar2 = *puVar22;
    auVar25._8_8_ = uVar1;
    auVar25._0_8_ = uVar2;
    uVar35 = *(ulong *)((long)puVar20 + (long)a_stride * 2);
    uVar3 = *puVar20;
    uVar4 = *(undefined8 *)((long)puVar23 + (long)b_stride * 2);
    auVar29._8_4_ = 0;
    auVar29._0_8_ = uVar35;
    auVar29._12_2_ = (short)(uVar35 >> 0x30);
    auVar29._14_2_ = (short)((ulong)uVar4 >> 0x30);
    auVar28._12_4_ = auVar29._12_4_;
    auVar28._8_2_ = 0;
    auVar28._0_8_ = uVar35;
    auVar28._10_2_ = (short)((ulong)uVar4 >> 0x20);
    auVar27._10_6_ = auVar28._10_6_;
    auVar27._8_2_ = (short)(uVar35 >> 0x20);
    auVar27._0_8_ = uVar35;
    auVar26._8_8_ = auVar27._8_8_;
    auVar26._6_2_ = (short)((ulong)uVar4 >> 0x10);
    auVar26._4_2_ = (short)(uVar35 >> 0x10);
    auVar26._0_2_ = (undefined2)uVar35;
    auVar26._2_2_ = (short)uVar4;
    uVar4 = *puVar23;
    auVar33._8_4_ = 0;
    auVar33._0_8_ = uVar3;
    auVar33._12_2_ = (short)(uVar3 >> 0x30);
    auVar33._14_2_ = (short)((ulong)uVar4 >> 0x30);
    auVar32._12_4_ = auVar33._12_4_;
    auVar32._8_2_ = 0;
    auVar32._0_8_ = uVar3;
    auVar32._10_2_ = (short)((ulong)uVar4 >> 0x20);
    auVar31._10_6_ = auVar32._10_6_;
    auVar31._8_2_ = (short)(uVar3 >> 0x20);
    auVar31._0_8_ = uVar3;
    auVar30._8_8_ = auVar31._8_8_;
    auVar30._6_2_ = (short)((ulong)uVar4 >> 0x10);
    auVar30._4_2_ = (short)(uVar3 >> 0x10);
    auVar30._0_2_ = (undefined2)uVar3;
    auVar30._2_2_ = (short)uVar4;
    uVar5 = *(undefined4 *)(m_ptr + m_stride);
    uVar6 = *(undefined4 *)m_ptr;
    uVar35 = CONCAT44(uVar5,uVar6);
    uVar39 = (undefined1)((uint)uVar5 >> 0x18);
    auVar7._8_6_ = 0;
    auVar7._0_8_ = uVar35;
    auVar7[0xe] = uVar39;
    auVar8._8_4_ = 0;
    auVar8._0_8_ = uVar35;
    auVar8[0xc] = (char)((uint)uVar5 >> 0x10);
    auVar8._13_2_ = auVar7._13_2_;
    auVar9._8_4_ = 0;
    auVar9._0_8_ = uVar35;
    auVar9._12_3_ = auVar8._12_3_;
    auVar10._8_2_ = 0;
    auVar10._0_8_ = uVar35;
    auVar10[10] = (char)((uint)uVar5 >> 8);
    auVar10._11_4_ = auVar9._11_4_;
    auVar11._8_2_ = 0;
    auVar11._0_8_ = uVar35;
    auVar11._10_5_ = auVar10._10_5_;
    auVar12[8] = (char)uVar5;
    auVar12._0_8_ = uVar35;
    auVar12._9_6_ = auVar11._9_6_;
    auVar16._7_8_ = 0;
    auVar16._0_7_ = auVar12._8_7_;
    Var17 = CONCAT81(SUB158(auVar16 << 0x40,7),(char)((uint)uVar6 >> 0x18));
    auVar19._9_6_ = 0;
    auVar19._0_9_ = Var17;
    auVar13[4] = (char)((uint)uVar6 >> 0x10);
    auVar13._0_4_ = uVar6;
    auVar13._5_10_ = SUB1510(auVar19 << 0x30,5);
    auVar18._11_4_ = 0;
    auVar18._0_11_ = auVar13._4_11_;
    uVar34 = (ushort)uVar6;
    auVar14[2] = (char)((uint)uVar6 >> 8);
    auVar14._0_2_ = uVar34;
    auVar14._3_12_ = SUB1512(auVar18 << 0x20,3);
    auVar15._2_13_ = auVar14._2_13_;
    auVar15._0_2_ = uVar34 & 0xff;
    sVar38 = (short)Var17;
    auVar42._0_12_ = auVar15._0_12_;
    auVar42._12_2_ = sVar38;
    auVar42._14_2_ = 0x40 - sVar38;
    auVar41._12_4_ = auVar42._12_4_;
    auVar41._0_10_ = auVar15._0_10_;
    auVar41._10_2_ = 0x40 - auVar13._4_2_;
    auVar40._10_6_ = auVar41._10_6_;
    auVar40._8_2_ = auVar13._4_2_;
    auVar40._6_2_ = 0x40 - auVar14._2_2_;
    auVar40._4_2_ = auVar14._2_2_;
    auVar40._0_4_ = CONCAT22(0x40 - (uVar34 & 0xff),uVar34) & 0xffff00ff;
    auVar43 = pmaddwd(auVar40,auVar30);
    auVar44._0_4_ = auVar43._0_4_ + 0x20 >> 6;
    auVar44._4_4_ = auVar43._4_4_ + 0x20 >> 6;
    auVar44._8_4_ = auVar43._8_4_ + 0x20 >> 6;
    auVar44._12_4_ = auVar43._12_4_ + 0x20 >> 6;
    auVar36._2_2_ = 0x40 - auVar12._8_2_;
    auVar36._0_2_ = auVar12._8_2_;
    auVar36._4_2_ = auVar10._10_2_;
    auVar36._6_2_ = 0x40 - auVar10._10_2_;
    auVar36._8_2_ = auVar8._12_2_;
    auVar36._10_2_ = 0x40 - auVar8._12_2_;
    auVar36[0xc] = uVar39;
    auVar36[0xd] = 0;
    auVar36._14_2_ = 0x40 - (auVar7._13_2_ >> 8);
    auVar43 = pmaddwd(auVar36,auVar26);
    auVar37._0_4_ = auVar43._0_4_ + 0x20 >> 6;
    auVar37._4_4_ = auVar43._4_4_ + 0x20 >> 6;
    auVar37._8_4_ = auVar43._8_4_ + 0x20 >> 6;
    auVar37._12_4_ = auVar43._12_4_ + 0x20 >> 6;
    auVar43 = packssdw(auVar44,auVar37);
    auVar45._0_2_ = auVar43._0_2_ - (short)uVar2;
    auVar45._2_2_ = auVar43._2_2_ - (short)((ulong)uVar2 >> 0x10);
    auVar45._4_2_ = auVar43._4_2_ - (short)((ulong)uVar2 >> 0x20);
    auVar45._6_2_ = auVar43._6_2_ - (short)((ulong)uVar2 >> 0x30);
    auVar45._8_2_ = auVar43._8_2_ - (short)uVar1;
    auVar45._10_2_ = auVar43._10_2_ - (short)((ulong)uVar1 >> 0x10);
    auVar45._12_2_ = auVar43._12_2_ - (short)((ulong)uVar1 >> 0x20);
    auVar45._14_2_ = auVar43._14_2_ - (short)((ulong)uVar1 >> 0x30);
    auVar43 = pabsw(auVar25,auVar45);
    auVar25 = pmaddwd(auVar43,_DAT_0046feb0);
    auVar43._0_4_ = auVar24._0_4_ + auVar25._0_4_;
    auVar43._4_4_ = auVar24._4_4_ + auVar25._4_4_;
    auVar43._8_4_ = auVar24._8_4_ + auVar25._8_4_;
    auVar43._12_4_ = auVar24._12_4_ + auVar25._12_4_;
    m_ptr = m_ptr + m_stride * 2;
    puVar23 = (undefined8 *)((long)puVar23 + (long)(b_stride * 2) * 2);
    puVar20 = (ulong *)((long)puVar20 + (long)(a_stride * 2) * 2);
    puVar22 = (undefined8 *)((long)puVar22 + (long)(src_stride * 2) * 2);
    auVar24 = auVar43;
  }
  auVar24 = phaddd(auVar24,auVar24);
  auVar24 = phaddd(auVar24,auVar24);
  return auVar24._0_4_;
}

Assistant:

unsigned int aom_highbd_masked_sad4xh_ssse3(const uint8_t *src8, int src_stride,
                                            const uint8_t *a8, int a_stride,
                                            const uint8_t *b8, int b_stride,
                                            const uint8_t *m_ptr, int m_stride,
                                            int height) {
  const uint16_t *src_ptr = CONVERT_TO_SHORTPTR(src8);
  const uint16_t *a_ptr = CONVERT_TO_SHORTPTR(a8);
  const uint16_t *b_ptr = CONVERT_TO_SHORTPTR(b8);
  int y;
  __m128i res = _mm_setzero_si128();
  const __m128i mask_max = _mm_set1_epi16((1 << AOM_BLEND_A64_ROUND_BITS));
  const __m128i round_const =
      _mm_set1_epi32((1 << AOM_BLEND_A64_ROUND_BITS) >> 1);
  const __m128i one = _mm_set1_epi16(1);

  for (y = 0; y < height; y += 2) {
    const __m128i src = _mm_unpacklo_epi64(
        _mm_loadl_epi64((const __m128i *)src_ptr),
        _mm_loadl_epi64((const __m128i *)&src_ptr[src_stride]));
    const __m128i a =
        _mm_unpacklo_epi64(_mm_loadl_epi64((const __m128i *)a_ptr),
                           _mm_loadl_epi64((const __m128i *)&a_ptr[a_stride]));
    const __m128i b =
        _mm_unpacklo_epi64(_mm_loadl_epi64((const __m128i *)b_ptr),
                           _mm_loadl_epi64((const __m128i *)&b_ptr[b_stride]));
    // Zero-extend mask to 16 bits
    const __m128i m = _mm_unpacklo_epi8(
        _mm_unpacklo_epi32(_mm_cvtsi32_si128(*(const int *)m_ptr),
                           _mm_cvtsi32_si128(*(const int *)&m_ptr[m_stride])),
        _mm_setzero_si128());
    const __m128i m_inv = _mm_sub_epi16(mask_max, m);

    const __m128i data_l = _mm_unpacklo_epi16(a, b);
    const __m128i mask_l = _mm_unpacklo_epi16(m, m_inv);
    __m128i pred_l = _mm_madd_epi16(data_l, mask_l);
    pred_l = _mm_srai_epi32(_mm_add_epi32(pred_l, round_const),
                            AOM_BLEND_A64_ROUND_BITS);

    const __m128i data_r = _mm_unpackhi_epi16(a, b);
    const __m128i mask_r = _mm_unpackhi_epi16(m, m_inv);
    __m128i pred_r = _mm_madd_epi16(data_r, mask_r);
    pred_r = _mm_srai_epi32(_mm_add_epi32(pred_r, round_const),
                            AOM_BLEND_A64_ROUND_BITS);

    const __m128i pred = _mm_packs_epi32(pred_l, pred_r);
    const __m128i diff = _mm_abs_epi16(_mm_sub_epi16(pred, src));
    res = _mm_add_epi32(res, _mm_madd_epi16(diff, one));

    src_ptr += src_stride * 2;
    a_ptr += a_stride * 2;
    b_ptr += b_stride * 2;
    m_ptr += m_stride * 2;
  }
  res = _mm_hadd_epi32(res, res);
  res = _mm_hadd_epi32(res, res);
  int sad = _mm_cvtsi128_si32(res);
  return sad;
}